

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

int ddSymmSiftingBackward(DdManager *table,Move *moves,int size)

{
  Move **ppMVar1;
  uint x;
  uint uVar2;
  int iVar3;
  uint x_00;
  uint uVar4;
  Move *pMVar5;
  DdSubtable *pDVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  int iVar13;
  uint y;
  int iVar14;
  int iVar15;
  bool bVar16;
  
  iVar15 = 1;
  pMVar5 = moves;
  if (moves != (Move *)0x0) {
    do {
      if (pMVar5->size < size) {
        size = pMVar5->size;
      }
      ppMVar1 = &pMVar5->next;
      pMVar5 = *ppMVar1;
    } while (*ppMVar1 != (Move *)0x0);
    while( true ) {
      if (moves == (Move *)0x0) {
        return 1;
      }
      if (moves->size == size) {
        return 1;
      }
      pDVar6 = table->subtables;
      x = moves->x;
      uVar12 = moves->y;
      uVar9 = (ulong)uVar12;
      if ((pDVar6[x].next == x) && (pDVar6[uVar9].next == uVar12)) {
        iVar3 = cuddSwapInPlace(table,x,uVar12);
      }
      else {
        uVar2 = pDVar6[(int)x].next;
        do {
          uVar10 = (uint)uVar9;
          uVar9 = (ulong)pDVar6[(int)uVar10].next;
        } while (uVar10 < pDVar6[(int)uVar10].next);
        iVar13 = x - uVar2;
        iVar15 = uVar10 - uVar12;
        uVar8 = uVar2;
        if (iVar15 < 0) {
          iVar3 = -1;
        }
        else {
          iVar3 = -1;
          uVar4 = x;
          y = uVar12;
          iVar7 = 1;
          do {
            iVar14 = iVar13 + 1;
            if (-1 < iVar13) {
              do {
                x_00 = uVar4;
                iVar3 = cuddSwapInPlace(table,x_00,y);
                if (iVar3 == 0) goto LAB_0079c0d3;
                uVar4 = cuddNextLow(table,x_00);
                iVar14 = iVar14 + -1;
                y = x_00;
              } while (iVar14 != 0);
            }
            y = iVar7 + uVar12;
            uVar4 = (iVar7 + uVar12) - 1;
            bVar16 = iVar7 != iVar15 + 1;
            iVar7 = iVar7 + 1;
          } while (bVar16);
          pDVar6 = table->subtables;
          if (uVar10 != uVar12) {
            puVar11 = &pDVar6[(int)uVar2].next;
            do {
              uVar8 = uVar8 + 1;
              *puVar11 = uVar8;
              puVar11 = puVar11 + 0xe;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
        }
        pDVar6[(int)uVar8].next = uVar2;
        uVar10 = uVar8 + 1;
        uVar12 = uVar10;
        if (0 < iVar13) {
          puVar11 = &pDVar6[(int)uVar10].next;
          uVar8 = uVar8 + 2;
          iVar15 = 0;
          do {
            *puVar11 = uVar8;
            puVar11 = puVar11 + 0xe;
            iVar15 = iVar15 + -1;
            uVar8 = uVar8 + 1;
          } while (uVar2 - x != iVar15);
          uVar12 = uVar10 - iVar15;
        }
        pDVar6[(int)uVar12].next = uVar10;
      }
      if (iVar3 == 0) break;
      moves = moves->next;
    }
LAB_0079c0d3:
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int
ddSymmSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res = -1;

    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (table->subtables[move->x].next == move->x && table->subtables[move->y].next == move->y) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
#ifdef DD_DEBUG
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = ddSymmGroupMoveBackward(table,(int)move->x,(int)move->y);
        }
        if (!res) return(0);
    }

    return(1);

}